

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::sectionEnded(RunContext *this,SectionInfo *info,Counts *prevAssertions)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  IConfig *pIVar5;
  IStreamingReporter *pIVar6;
  long in_RDI;
  bool missingAssertions;
  Counts assertions;
  value_type *in_stack_fffffffffffffe98;
  RunningTest *in_stack_fffffffffffffea0;
  Counts *_assertions;
  SectionInfo *in_stack_fffffffffffffea8;
  SectionStats *in_stack_fffffffffffffeb0;
  Counts local_140 [8];
  undefined1 local_b1;
  Counts local_b0 [2];
  UnfinishedSections local_90;
  
  uVar3 = std::uncaught_exception();
  if ((uVar3 & 1) == 0) {
    local_b0[0] = Counts::operator-((Counts *)in_stack_fffffffffffffea0,
                                    (Counts *)in_stack_fffffffffffffe98);
    local_b1 = 0;
    sVar4 = Counts::total(local_b0);
    if (sVar4 == 0) {
      pIVar5 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)(in_RDI + 0xf8));
      uVar2 = (*(pIVar5->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
      if (((uVar2 & 1) != 0) &&
         (bVar1 = RunningTest::isBranchSection(in_stack_fffffffffffffea0), !bVar1)) {
        *(long *)(in_RDI + 0x108) = *(long *)(in_RDI + 0x108) + 1;
        local_b0[0].failed = local_b0[0].failed + 1;
        local_b1 = 1;
      }
    }
    RunningTest::endSection
              ((RunningTest *)in_stack_fffffffffffffeb0,&in_stack_fffffffffffffea8->name,
               SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
    pIVar6 = Ptr<Catch::IStreamingReporter>::operator->
                       ((Ptr<Catch::IStreamingReporter> *)(in_RDI + 0x120));
    _assertions = local_140;
    SectionStats::SectionStats
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,_assertions,
               SUB81((ulong)pIVar6 >> 0x38,0));
    (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar6,_assertions);
    SectionStats::~SectionStats((SectionStats *)0x1cab20);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x1cab31);
  }
  else {
    UnfinishedSections::UnfinishedSections
              (&local_90,(SectionInfo *)(in_RDI + 0x1c8),(Counts *)in_stack_fffffffffffffea0);
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::push_back((vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
                 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    UnfinishedSections::~UnfinishedSections((UnfinishedSections *)0x1ca9d7);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = false;
            if( assertions.total() == 0 &&
                    m_config->warnAboutMissingAssertions() &&
                    !m_runningTest->isBranchSection() ) {
                m_totals.assertions.failed++;
                assertions.failed++;
                missingAssertions = true;

            }
            m_runningTest->endSection( info.name, false );

            m_reporter->sectionEnded( SectionStats( info, assertions, missingAssertions ) );
            m_messages.clear();
        }